

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::setVolumeMass(btSoftBody *this,btScalar mass)

{
  int iVar1;
  Node *pNVar2;
  Tetra *pTVar3;
  Node *pNVar4;
  undefined1 auVar5 [16];
  float *__s;
  btScalar *pbVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  Node **ppNVar10;
  long lVar11;
  int j;
  long lVar12;
  size_t size;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  btAlignedObjectArray<float> ranks;
  btAlignedObjectArray<float> bStack_48;
  btScalar local_24;
  
  bStack_48.m_ownsMemory = true;
  bStack_48.m_data = (float *)0x0;
  bStack_48.m_size = 0;
  bStack_48.m_capacity = 0;
  iVar1 = (this->m_nodes).m_size;
  local_24 = mass;
  if ((-1 < (long)iVar1) && (iVar1 != 0)) {
    size = (long)iVar1 << 2;
    __s = (float *)btAlignedAllocInternal(size,0x10);
    if (0 < (long)bStack_48.m_size) {
      lVar7 = 0;
      do {
        __s[lVar7] = bStack_48.m_data[lVar7];
        lVar7 = lVar7 + 1;
      } while (bStack_48.m_size != lVar7);
    }
    if ((bStack_48.m_data != (float *)0x0) && (bStack_48.m_ownsMemory == true)) {
      btAlignedFreeInternal(bStack_48.m_data);
    }
    bStack_48.m_ownsMemory = true;
    bStack_48.m_data = __s;
    bStack_48.m_capacity = iVar1;
    if (iVar1 != 0) {
      memset(__s,0,size);
    }
  }
  auVar5 = _DAT_001f5270;
  bStack_48.m_size = iVar1;
  iVar1 = (this->m_nodes).m_size;
  lVar7 = (long)iVar1;
  if (0 < lVar7) {
    pNVar2 = (this->m_nodes).m_data;
    lVar9 = lVar7 + -1;
    auVar13._8_4_ = (int)lVar9;
    auVar13._0_8_ = lVar9;
    auVar13._12_4_ = (int)((ulong)lVar9 >> 0x20);
    lVar9 = 0;
    auVar13 = auVar13 ^ _DAT_001f5270;
    auVar14 = _DAT_001f57f0;
    auVar15 = _DAT_001f55c0;
    do {
      auVar16 = auVar15 ^ auVar5;
      iVar8 = auVar13._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar8 && auVar13._0_4_ < auVar16._0_4_ || iVar8 < auVar16._4_4_)
                & 1)) {
        *(undefined4 *)((long)(&pNVar2->m_n + 1) + lVar9) = 0;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        *(undefined4 *)((long)(&pNVar2[1].m_n + 1) + lVar9) = 0;
      }
      auVar16 = auVar14 ^ auVar5;
      iVar17 = auVar16._4_4_;
      if (iVar17 <= iVar8 && (iVar17 != iVar8 || auVar16._0_4_ <= auVar13._0_4_)) {
        *(undefined4 *)((long)(&pNVar2[2].m_n + 1) + lVar9) = 0;
        *(undefined4 *)((long)(&pNVar2[3].m_n + 1) + lVar9) = 0;
      }
      lVar11 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar11 + 4;
      lVar11 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar11 + 4;
      lVar9 = lVar9 + 0x1e0;
    } while ((ulong)(iVar1 + 3U >> 2) * 0x1e0 - lVar9 != 0);
  }
  lVar9 = (long)(this->m_tetras).m_size;
  if (0 < lVar9) {
    pNVar2 = (this->m_nodes).m_data;
    pTVar3 = (this->m_tetras).m_data;
    ppNVar10 = pTVar3->m_n;
    lVar11 = 0;
    do {
      lVar12 = 0;
      do {
        pNVar4 = ppNVar10[lVar12];
        pNVar4->m_im = ABS(pTVar3[lVar11].m_rv) + pNVar4->m_im;
        iVar8 = (int)((ulong)((long)pNVar4 - (long)pNVar2) >> 3) * -0x11111111;
        bStack_48.m_data[iVar8] = bStack_48.m_data[iVar8] + 1.0;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 4);
      lVar11 = lVar11 + 1;
      ppNVar10 = ppNVar10 + 0x11;
    } while (lVar11 != lVar9);
  }
  if (0 < iVar1) {
    pbVar6 = &((this->m_nodes).m_data)->m_im;
    lVar9 = 0;
    do {
      if (0.0 < *pbVar6) {
        *pbVar6 = bStack_48.m_data[lVar9] / *pbVar6;
      }
      lVar9 = lVar9 + 1;
      pbVar6 = pbVar6 + 0x1e;
    } while (lVar7 != lVar9);
  }
  setTotalMass(this,local_24,false);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&bStack_48);
  return;
}

Assistant:

void			btSoftBody::setVolumeMass(btScalar mass)
{
btAlignedObjectArray<btScalar>	ranks;
ranks.resize(m_nodes.size(),0);
int i;

for(i=0;i<m_nodes.size();++i)
	{
	m_nodes[i].m_im=0;
	}
for(i=0;i<m_tetras.size();++i)
	{
	const Tetra& t=m_tetras[i];
	for(int j=0;j<4;++j)
		{
		t.m_n[j]->m_im+=btFabs(t.m_rv);
		ranks[int(t.m_n[j]-&m_nodes[0])]+=1;
		}
	}
for( i=0;i<m_nodes.size();++i)
	{
	if(m_nodes[i].m_im>0)
		{
		m_nodes[i].m_im=ranks[i]/m_nodes[i].m_im;
		}
	}
setTotalMass(mass,false);
}